

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

_Bool see_wall(wchar_t dir,loc_conflict grid)

{
  _Bool _Var1;
  loc grid_00;
  
  grid_00 = (loc)loc_sum(grid,(loc_conflict)ddgrid[dir]);
  _Var1 = square_in_bounds(cave,grid_00);
  if (_Var1) {
    _Var1 = square_iswebbed(cave,grid_00);
    if (_Var1) {
      return true;
    }
    _Var1 = square_seemslikewall(cave,grid_00);
    if (_Var1) {
      _Var1 = square_isknown(cave,grid_00);
      return _Var1;
    }
  }
  return false;
}

Assistant:

static bool see_wall(int dir, struct loc grid)
{
	/* Get the new location */
	grid = loc_sum(grid, ddgrid[dir]);

	/* Illegal grids are not known walls XXX XXX XXX */
	if (!square_in_bounds(cave, grid)) return false;

	/* Webs are enough like walls */
	if (square_iswebbed(cave, grid)) return true;

	/* Non-wall grids are not known walls */
	if (!square_seemslikewall(cave, grid)) return false;

	/* Unknown walls are not known walls */
	if (!square_isknown(cave, grid)) return false;

	/* Default */
	return true;
}